

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

ErrorData * __thiscall
duckdb::ART::Insert(ErrorData *__return_storage_ptr__,ART *this,IndexLock *l,DataChunk *chunk,
                   Vector *row_ids,IndexAppendInfo *info)

{
  size_type __n;
  ARTConflictType AVar1;
  Allocator *allocator_00;
  DataChunk *pDVar2;
  idx_t i;
  ulong uVar3;
  long lVar4;
  idx_t iVar5;
  optional_idx conflict_idx;
  TransactionException local_150;
  string msg;
  optional_ptr<duckdb::ART,_true> local_118;
  string local_110;
  IndexAppendInfo *local_f0;
  unsafe_vector<ARTKey> row_id_keys;
  unsafe_vector<ARTKey> keys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ArenaAllocator allocator;
  
  __n = chunk->count;
  allocator_00 = BufferAllocator::Get((this->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&allocator,allocator_00,0x800);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::vector
            (&keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>,__n,
             (allocator_type *)&msg);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::vector
            (&row_id_keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>,__n,
             (allocator_type *)&msg);
  GenerateKeyVectors(this,&allocator,chunk,row_ids,&keys,&row_id_keys);
  if ((info->delete_index).ptr == (BoundIndex *)0x0) {
    local_118.ptr = (ART *)0x0;
  }
  else {
    optional_ptr<duckdb::BoundIndex,_true>::CheckValid(&info->delete_index);
    local_118.ptr = (ART *)(info->delete_index).ptr;
  }
  conflict_idx.index = 0xffffffffffffffff;
  if (__n != 0) {
    lVar4 = 0;
    iVar5 = 0;
    local_f0 = info;
    do {
      if (*(long *)((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            _M_impl.super__Vector_impl_data._M_start)->len + lVar4) != 0) {
        row_ids = (Vector *)0x0;
        AVar1 = Insert(this,&this->tree,
                       (ARTKey *)
                       ((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar4),0,
                       (ARTKey *)
                       ((long)&(row_id_keys.
                                super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar4),
                       (GateStatus)((this->tree).super_IndexPointer.data >> 0x3f),local_118,
                       local_f0->append_mode);
        if (AVar1 != NO_CONFLICT) {
          optional_idx::optional_idx((optional_idx *)&msg,iVar5);
          conflict_idx.index = (idx_t)msg._M_dataplus._M_p;
          goto LAB_015cabc9;
        }
      }
      iVar5 = iVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (__n != iVar5);
  }
  AVar1 = NO_CONFLICT;
LAB_015cabc9:
  if (AVar1 == NO_CONFLICT) {
LAB_015cad09:
    ErrorData::ErrorData(__return_storage_ptr__);
  }
  else {
    lVar4 = 0;
    for (uVar3 = 0; iVar5 = optional_idx::GetIndex(&conflict_idx), uVar3 < iVar5; uVar3 = uVar3 + 1)
    {
      if (*(long *)((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            _M_impl.super__Vector_impl_data._M_start)->len + lVar4) != 0) {
        row_ids = (Vector *)0x0;
        Erase(this,&this->tree,
              (ARTKey *)
              ((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start)->len + lVar4),0,
              (ARTKey *)
              ((long)&(row_id_keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                       super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                       super__Vector_impl_data._M_start)->len + lVar4),
              (GateStatus)((this->tree).super_IndexPointer.data >> 0x3f));
      }
      lVar4 = lVar4 + 0x10;
    }
    if (AVar1 == CONSTRAINT) {
      pDVar2 = (DataChunk *)optional_idx::GetIndex(&conflict_idx);
      BoundIndex::AppendRowError_abi_cxx11_(&msg,(BoundIndex *)chunk,pDVar2,(idx_t)row_ids);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "PRIMARY KEY or UNIQUE constraint violation: duplicate key \"%s\"","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,msg._M_dataplus._M_p,
                 msg._M_dataplus._M_p + msg._M_string_length);
      ConstraintException::ConstraintException<std::__cxx11::string>
                ((ConstraintException *)&local_150,&local_110,&local_b8);
      ErrorData::ErrorData(__return_storage_ptr__,(exception *)&local_150);
      ::std::runtime_error::~runtime_error((runtime_error *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p == &msg.field_2) goto LAB_015cade5;
    }
    else {
      if (AVar1 != TRANSACTION) goto LAB_015cad09;
      pDVar2 = (DataChunk *)optional_idx::GetIndex(&conflict_idx);
      BoundIndex::AppendRowError_abi_cxx11_(&msg,(BoundIndex *)chunk,pDVar2,(idx_t)row_ids);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"write-write conflict on key: \"%s\"","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,msg._M_dataplus._M_p,
                 msg._M_dataplus._M_p + msg._M_string_length);
      TransactionException::TransactionException<std::__cxx11::string>
                (&local_150,&local_110,&local_98);
      ErrorData::ErrorData(__return_storage_ptr__,(exception *)&local_150);
      ::std::runtime_error::~runtime_error((runtime_error *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p == &msg.field_2) goto LAB_015cade5;
    }
    operator_delete(msg._M_dataplus._M_p);
  }
LAB_015cade5:
  if (row_id_keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
      super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(row_id_keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
      super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ArenaAllocator::~ArenaAllocator(&allocator);
  return __return_storage_ptr__;
}

Assistant:

ErrorData ART::Insert(IndexLock &l, DataChunk &chunk, Vector &row_ids, IndexAppendInfo &info) {
	D_ASSERT(row_ids.GetType().InternalType() == ROW_TYPE);
	auto row_count = chunk.size();

	ArenaAllocator allocator(BufferAllocator::Get(db));
	unsafe_vector<ARTKey> keys(row_count);
	unsafe_vector<ARTKey> row_id_keys(row_count);
	GenerateKeyVectors(allocator, chunk, row_ids, keys, row_id_keys);

	optional_ptr<ART> delete_art;
	if (info.delete_index) {
		delete_art = info.delete_index->Cast<ART>();
	}

	auto conflict_type = ARTConflictType::NO_CONFLICT;
	optional_idx conflict_idx;
	auto was_empty = !tree.HasMetadata();

	// Insert the entries into the index.
	for (idx_t i = 0; i < row_count; i++) {
		if (keys[i].Empty()) {
			continue;
		}
		conflict_type = Insert(tree, keys[i], 0, row_id_keys[i], tree.GetGateStatus(), delete_art, info.append_mode);
		if (conflict_type != ARTConflictType::NO_CONFLICT) {
			conflict_idx = i;
			break;
		}
	}

	// Remove any previously inserted entries.
	if (conflict_type != ARTConflictType::NO_CONFLICT) {
		D_ASSERT(conflict_idx.IsValid());
		for (idx_t i = 0; i < conflict_idx.GetIndex(); i++) {
			if (keys[i].Empty()) {
				continue;
			}
			Erase(tree, keys[i], 0, row_id_keys[i], tree.GetGateStatus());
		}
	}

	if (was_empty) {
		// All nodes are in-memory.
		VerifyAllocationsInternal();
	}

	if (conflict_type == ARTConflictType::TRANSACTION) {
		auto msg = AppendRowError(chunk, conflict_idx.GetIndex());
		return ErrorData(TransactionException("write-write conflict on key: \"%s\"", msg));
	}

	if (conflict_type == ARTConflictType::CONSTRAINT) {
		auto msg = AppendRowError(chunk, conflict_idx.GetIndex());
		return ErrorData(ConstraintException("PRIMARY KEY or UNIQUE constraint violation: duplicate key \"%s\"", msg));
	}

#ifdef DEBUG
	for (idx_t i = 0; i < row_count; i++) {
		if (keys[i].Empty()) {
			continue;
		}
		D_ASSERT(Lookup(tree, keys[i], 0));
	}
#endif
	return ErrorData();
}